

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::DictVectorizer::ByteSizeLong(DictVectorizer *this)

{
  size_t sVar1;
  
  if (this->_oneof_case_[0] == 2) {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Vector>((this->Map_).int64toindex_);
  }
  else {
    if (this->_oneof_case_[0] != 1) {
      sVar1 = 0;
      goto LAB_00234660;
    }
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>((this->Map_).stringtoindex_);
  }
  sVar1 = sVar1 + 1;
LAB_00234660:
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t DictVectorizer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DictVectorizer)
  size_t total_size = 0;

  switch (Map_case()) {
    // .CoreML.Specification.StringVector stringToIndex = 1;
    case kStringToIndex: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Map_.stringtoindex_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ToIndex = 2;
    case kInt64ToIndex: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Map_.int64toindex_);
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}